

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O0

int VP8ApplyNearLossless(WebPPicture *picture,int quality,uint32_t *argb_dst)

{
  int iVar1;
  void *pvVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int limit_bits;
  uint32_t *copy_buffer;
  int stride;
  int ysize;
  int xsize;
  int i;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint64_t in_stack_ffffffffffffffc8;
  undefined4 local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  iVar3 = *(int *)(in_RDI + 8);
  iVar1 = *(int *)(in_RDI + 0xc);
  pvVar2 = WebPSafeMalloc(in_stack_ffffffffffffffc8,
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_24 = VP8LNearLosslessBits(in_ESI);
  if (pvVar2 == (void *)0x0) {
    iVar3 = 0;
  }
  else if (((iVar3 < 0x40) && (iVar1 < 0x40)) || (iVar1 < 3)) {
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      memcpy((void *)(in_RDX + (long)(local_24 * iVar3) * 4),
             (void *)(*(long *)(in_RDI + 0x48) + (long)(local_24 * *(int *)(in_RDI + 0x50)) * 4),
             (long)iVar3 << 2);
    }
    WebPSafeFree((void *)0x195c61);
    iVar3 = 1;
  }
  else {
    NearLossless(unaff_retaddr_00,unaff_retaddr,
                 (uint32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (uint32_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),copy_buffer);
    while (local_24 = local_24 + -1, local_24 != 0) {
      NearLossless(unaff_retaddr_00,unaff_retaddr,
                   (uint32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (uint32_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),copy_buffer);
    }
    WebPSafeFree((void *)0x195ced);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int VP8ApplyNearLossless(const WebPPicture* const picture, int quality,
                         uint32_t* const argb_dst) {
  int i;
  const int xsize = picture->width;
  const int ysize = picture->height;
  const int stride = picture->argb_stride;
  uint32_t* const copy_buffer =
      (uint32_t*)WebPSafeMalloc(xsize * 3, sizeof(*copy_buffer));
  const int limit_bits = VP8LNearLosslessBits(quality);
  assert(argb_dst != NULL);
  assert(limit_bits > 0);
  assert(limit_bits <= MAX_LIMIT_BITS);
  if (copy_buffer == NULL) {
    return 0;
  }
  // For small icon images, don't attempt to apply near-lossless compression.
  if ((xsize < MIN_DIM_FOR_NEAR_LOSSLESS &&
       ysize < MIN_DIM_FOR_NEAR_LOSSLESS) ||
      ysize < 3) {
    for (i = 0; i < ysize; ++i) {
      memcpy(argb_dst + i * xsize, picture->argb + i * picture->argb_stride,
             xsize * sizeof(*argb_dst));
    }
    WebPSafeFree(copy_buffer);
    return 1;
  }

  NearLossless(xsize, ysize, picture->argb, stride, limit_bits, copy_buffer,
               argb_dst);
  for (i = limit_bits - 1; i != 0; --i) {
    NearLossless(xsize, ysize, argb_dst, xsize, i, copy_buffer, argb_dst);
  }
  WebPSafeFree(copy_buffer);
  return 1;
}